

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall PrimitiveTestClass::PrintArr<int*>(PrimitiveTestClass *this,int *arr)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < (ulong)(long)this->SIZE; uVar2 = uVar2 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,arr[uVar2]);
    std::operator<<(poVar1,", ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void PrintArr(T arr)
        {
            for (size_t i = 0; i < SIZE; i++)
            {
                cout << arr[i] << ", ";
            }
            
            cout << endl;
        }